

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O0

char * __thiscall
icu_63::SortKeyByteSink::GetAppendBuffer
          (SortKeyByteSink *this,int32_t min_capacity,int32_t desired_capacity_hint,char *scratch,
          int32_t scratch_capacity,int32_t *result_capacity)

{
  int iVar1;
  int32_t available;
  int32_t *result_capacity_local;
  int32_t scratch_capacity_local;
  char *scratch_local;
  int32_t desired_capacity_hint_local;
  int32_t min_capacity_local;
  SortKeyByteSink *this_local;
  
  if ((min_capacity < 1) || (scratch_capacity < min_capacity)) {
    *result_capacity = 0;
    this_local = (SortKeyByteSink *)0x0;
  }
  else {
    this_local = (SortKeyByteSink *)scratch;
    if (this->ignore_ < 1) {
      iVar1 = this->capacity_ - this->appended_;
      if (iVar1 < min_capacity) {
        iVar1 = (*(this->super_ByteSink)._vptr_ByteSink[6])
                          (this,(ulong)(uint)desired_capacity_hint,(ulong)(uint)this->appended_);
        if ((char)iVar1 == '\0') {
          *result_capacity = scratch_capacity;
        }
        else {
          *result_capacity = this->capacity_ - this->appended_;
          this_local = (SortKeyByteSink *)(this->buffer_ + this->appended_);
        }
      }
      else {
        *result_capacity = iVar1;
        this_local = (SortKeyByteSink *)(this->buffer_ + this->appended_);
      }
    }
    else {
      *result_capacity = scratch_capacity;
    }
  }
  return (char *)this_local;
}

Assistant:

char *
SortKeyByteSink::GetAppendBuffer(int32_t min_capacity,
                                 int32_t desired_capacity_hint,
                                 char *scratch,
                                 int32_t scratch_capacity,
                                 int32_t *result_capacity) {
    if (min_capacity < 1 || scratch_capacity < min_capacity) {
        *result_capacity = 0;
        return NULL;
    }
    if (ignore_ > 0) {
        // Do not write ignored bytes right at the end of the buffer.
        *result_capacity = scratch_capacity;
        return scratch;
    }
    int32_t available = capacity_ - appended_;
    if (available >= min_capacity) {
        *result_capacity = available;
        return buffer_ + appended_;
    } else if (Resize(desired_capacity_hint, appended_)) {
        *result_capacity = capacity_ - appended_;
        return buffer_ + appended_;
    } else {
        *result_capacity = scratch_capacity;
        return scratch;
    }
}